

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::MarkBlockAsLive(AggressiveDCEPass *this,Instruction *inst)

{
  uint32_t id;
  Op OVar1;
  IRContext *pIVar2;
  BasicBlock *this_00;
  Instruction *pIVar3;
  DefUseManager *this_01;
  Instruction *mergeInst;
  Instruction *next_branch_inst;
  uint32_t merge_id;
  BasicBlock *basic_block;
  Instruction *inst_local;
  AggressiveDCEPass *this_local;
  
  pIVar2 = Pass::context((Pass *)this);
  this_00 = IRContext::get_instr_block(pIVar2,inst);
  if (this_00 != (BasicBlock *)0x0) {
    pIVar3 = BasicBlock::GetLabelInst(this_00);
    AddToWorklist(this,pIVar3);
    id = BasicBlock::MergeBlockIdIfAny(this_00);
    if (id == 0) {
      pIVar3 = BasicBlock::terminator(this_00);
      AddToWorklist(this,pIVar3);
    }
    else {
      pIVar2 = Pass::context((Pass *)this);
      this_01 = IRContext::get_def_use_mgr(pIVar2);
      pIVar3 = analysis::DefUseManager::GetDef(this_01,id);
      AddToWorklist(this,pIVar3);
    }
    OVar1 = opt::Instruction::opcode(inst);
    if (OVar1 != OpLabel) {
      MarkLoopConstructAsLiveIfLoopHeader(this,this_00);
    }
    pIVar3 = GetBranchForNextHeader(this,this_00);
    if (pIVar3 != (Instruction *)0x0) {
      AddToWorklist(this,pIVar3);
      pIVar3 = GetMergeInstruction(this,pIVar3);
      AddToWorklist(this,pIVar3);
    }
    OVar1 = opt::Instruction::opcode(inst);
    if ((OVar1 == OpLoopMerge) ||
       (OVar1 = opt::Instruction::opcode(inst), OVar1 == OpSelectionMerge)) {
      AddBreaksAndContinuesToWorklist(this,inst);
    }
  }
  return;
}

Assistant:

void AggressiveDCEPass::MarkBlockAsLive(Instruction* inst) {
  BasicBlock* basic_block = context()->get_instr_block(inst);
  if (basic_block == nullptr) {
    return;
  }

  // If we intend to keep this instruction, we need the block label and
  // block terminator to have a valid block for the instruction.
  AddToWorklist(basic_block->GetLabelInst());

  // We need to mark the successors blocks that follow as live.  If this is
  // header of the merge construct, the construct may be folded, but we will
  // definitely need the merge label.  If it is not a construct, the terminator
  // must be live, and the successor blocks will be marked as live when
  // processing the terminator.
  uint32_t merge_id = basic_block->MergeBlockIdIfAny();
  if (merge_id == 0) {
    AddToWorklist(basic_block->terminator());
  } else {
    AddToWorklist(context()->get_def_use_mgr()->GetDef(merge_id));
  }

  // Mark the structured control flow constructs that contains this block as
  // live.  If |inst| is an instruction in the loop header, then it is part of
  // the loop, so the loop construct must be live.  We exclude the label because
  // it does not matter how many times it is executed.  This could be extended
  // to more instructions, but we will need it for now.
  if (inst->opcode() != spv::Op::OpLabel)
    MarkLoopConstructAsLiveIfLoopHeader(basic_block);

  Instruction* next_branch_inst = GetBranchForNextHeader(basic_block);
  if (next_branch_inst != nullptr) {
    AddToWorklist(next_branch_inst);
    Instruction* mergeInst = GetMergeInstruction(next_branch_inst);
    AddToWorklist(mergeInst);
  }

  if (inst->opcode() == spv::Op::OpLoopMerge ||
      inst->opcode() == spv::Op::OpSelectionMerge) {
    AddBreaksAndContinuesToWorklist(inst);
  }
}